

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_opl.cpp
# Opt level: O2

void __thiscall
ymfm::opll_registers::cache_operator_data
          (opll_registers *this,uint32_t choffs,uint32_t opoffs,opdata_cache *cache)

{
  byte *pbVar1;
  uint8_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  uint8_t *puVar5;
  byte bVar6;
  uint32_t uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint8_t *puVar12;
  uint uVar13;
  uint uVar14;
  
  puVar12 = this->m_regdata;
  if ((choffs < 6) || ((this->m_regdata[0xe] & 0x20) == 0)) {
    puVar5 = this->m_instdata + ((this->m_regdata[choffs + 0x30] >> 1) - 8 & 0xfffffff8);
    if (this->m_regdata[choffs + 0x30] < 0x10) {
      puVar5 = puVar12;
    }
  }
  else {
    puVar5 = this->m_instdata + (choffs * 8 + 0x48);
  }
  this->m_chinst[choffs] = puVar5;
  uVar10 = opoffs & 1;
  this->m_opinst[opoffs] = puVar5 + uVar10;
  cache->waveform = this->m_waveform[(this->m_chinst[opoffs >> 1][3] >> uVar10 + 3 & 1) != 0];
  uVar4 = choffs + 0x20;
  uVar13 = this->m_regdata[uVar4] & 0xf;
  uVar14 = (uint)this->m_regdata[choffs + 0x10] | uVar13 << 8;
  cache->block_freq = uVar14;
  cache->detune = 0;
  pbVar1 = this->m_opinst[opoffs];
  uVar11 = (uint)((0xc2aaU >> (*pbVar1 & 0xf) & 1) != 0) | *pbVar1 & 0xe;
  uVar3 = 1;
  uVar7 = uVar11 * 2;
  if (uVar11 == 0) {
    uVar7 = uVar3;
  }
  cache->multiple = uVar7;
  if ((*pbVar1 & 0x40) == 0) {
    uVar3 = compute_phase_step(this,uVar11,opoffs,cache,0);
  }
  cache->phase_step = uVar3;
  if ((uVar10 == 0) && ((choffs < 7 || ((this->m_regdata[0xe] & 0x20) == 0)))) {
    uVar10 = this->m_chinst[choffs][2] & 0x3f;
  }
  else {
    uVar10 = (puVar12[(ulong)(opoffs >> 1) + 0x30] >> (~(byte)(opoffs << 2) & 4) & 0xf) << 2;
  }
  cache->total_level = uVar10 * 8;
  if (0x3f < pbVar1[2]) {
    iVar9 = (uint)(byte)opl_key_scale_atten(unsigned_int,unsigned_int)::fnum_to_atten
                        [uVar14 >> 5 & 0xf] + (~uVar13 & 0xe) * -4;
    iVar8 = 0;
    if (0 < iVar9) {
      iVar8 = iVar9;
    }
    cache->total_level = (iVar8 << (pbVar1[2] >> 6)) + uVar10 * 8;
  }
  cache->eg_sustain = ((pbVar1[6] >> 4) + 1 & 0xfffffff0 | (uint)(pbVar1[6] >> 4)) << 5;
  uVar13 = uVar13 >> ((byte)~*pbVar1 >> 3 & 2);
  cache->eg_rate[0] = '0';
  bVar6 = this->m_opinst[opoffs][4] >> 2;
  uVar11 = bVar6 & 0x3c;
  uVar10 = uVar13 + uVar11;
  uVar2 = (uint8_t)uVar10;
  if (0x3e < uVar10) {
    uVar2 = '?';
  }
  if ((bVar6 & 0x3c) == 0) {
    uVar2 = (uint8_t)uVar11;
  }
  cache->eg_rate[1] = uVar2;
  uVar10 = uVar13 + (this->m_opinst[opoffs][4] & 0xf) * 4;
  uVar2 = (uint8_t)uVar10;
  if (0x3e < uVar10) {
    uVar2 = '?';
  }
  if ((this->m_opinst[opoffs][4] & 0xf) == 0) {
    uVar2 = '\0';
  }
  cache->eg_rate[2] = uVar2;
  if ((*this->m_opinst[opoffs] & 0x20) == 0) {
    bVar6 = this->m_opinst[opoffs][6];
    iVar8 = (bVar6 & 0xf) * 4;
    uVar13 = uVar13 + iVar8;
    uVar2 = '?';
    if (uVar13 < 0x3f) {
      uVar2 = (uint8_t)uVar13;
    }
    if ((bVar6 & 0xf) == 0) {
      uVar2 = (uint8_t)iVar8;
    }
    cache->eg_rate[3] = uVar2;
    bVar6 = ((puVar12[uVar4] & 0x20) == 0) << 3 | 0x14;
  }
  else {
    cache->eg_rate[3] = '\0';
    bVar6 = 0x14;
    if ((puVar12[uVar4] & 0x20) == 0) {
      uVar10 = (this->m_opinst[opoffs][6] & 0xf) * 4;
      uVar13 = uVar13 + uVar10;
      uVar4 = 0x3f;
      if (uVar13 < 0x3f) {
        uVar4 = uVar13;
      }
      if ((this->m_opinst[opoffs][6] & 0xf) == 0) {
        uVar4 = uVar10;
      }
      bVar6 = (byte)uVar4;
    }
  }
  cache->eg_rate[4] = bVar6;
  return;
}

Assistant:

void opll_registers::cache_operator_data(uint32_t choffs, uint32_t opoffs, opdata_cache &cache)
{
	// first set up the instrument data
	uint32_t instrument = ch_instrument(choffs);
	if (rhythm_enable() && choffs >= 6)
		m_chinst[choffs] = &m_instdata[8 * (15 + (choffs - 6))];
	else
		m_chinst[choffs] = (instrument == 0) ? &m_regdata[0] : &m_instdata[8 * (instrument - 1)];
	m_opinst[opoffs] = m_chinst[choffs] + bitfield(opoffs, 0);

	// set up the easy stuff
	cache.waveform = &m_waveform[op_waveform(opoffs) % WAVEFORMS][0];

	// get frequency from the channel
	uint32_t block_freq = cache.block_freq = ch_block_freq(choffs);

	// compute the keycode: block_freq is:
	//
	//     11  |
	//     1098|76543210
	//     BBBF|FFFFFFFF
	//     ^^^^
	//
	// the 4-bit keycode uses the top 4 bits
	uint32_t keycode = bitfield(block_freq, 8, 4);

	// no detune adjustment on OPLL
	cache.detune = 0;

	// multiple value, as an x.1 value (0 means 0.5)
	// replace the low bit with a table lookup to give 0,1,2,3,4,5,6,7,8,9,10,10,12,12,15,15
	uint32_t multiple = op_multiple(opoffs);
	cache.multiple = ((multiple & 0xe) | bitfield(0xc2aa, multiple)) * 2;
	if (cache.multiple == 0)
		cache.multiple = 1;

	// phase step, or PHASE_STEP_DYNAMIC if PM is active; this depends on
	// block_freq, detune, and multiple, so compute it after we've done those
	if (op_lfo_pm_enable(opoffs) == 0)
		cache.phase_step = compute_phase_step(choffs, opoffs, cache, 0);
	else
		cache.phase_step = opdata_cache::PHASE_STEP_DYNAMIC;

	// total level, scaled by 8; for non-rhythm operator 0, this is the total
	// level from the instrument data; for other operators it is 4*volume
	if (bitfield(opoffs, 0) == 1 || (rhythm_enable() && choffs >= 7))
		cache.total_level = op_volume(opoffs) * 4;
	else
		cache.total_level = ch_total_level(choffs);
	cache.total_level <<= 3;

	// pre-add key scale level
	uint32_t ksl = op_ksl(opoffs);
	if (ksl != 0)
		cache.total_level += opl_key_scale_atten(bitfield(block_freq, 9, 3), bitfield(block_freq, 5, 4)) << ksl;

	// 4-bit sustain level, but 15 means 31 so effectively 5 bits
	cache.eg_sustain = op_sustain_level(opoffs);
	cache.eg_sustain |= (cache.eg_sustain + 1) & 0x10;
	cache.eg_sustain <<= 5;

	// The envelope diagram in the YM2413 datasheet gives values for these
	// in ms from 0->48dB. The attack/decay tables give values in ms from
	// 0->96dB, so to pick an equivalent decay rate, we want to find the
	// closest match that is 2x the 0->48dB value:
	//
	//     DP =   10ms (0->48db) ->   20ms (0->96db); decay of 12 gives   19.20ms
	//     RR =  310ms (0->48db) ->  620ms (0->96db); decay of  7 gives  613.76ms
	//     RS = 1200ms (0->48db) -> 2400ms (0->96db); decay of  5 gives 2455.04ms
	//
	// The envelope diagram for percussive sounds (eg_sustain() == 0) also uses
	// "RR" to mean both the constant RR above and the Release Rate specified in
	// the instrument data. In this case, Relief Pitcher's credit sound bears out
	// that the Release Rate is used during sustain, and that the constant RR
	// (or RS) is used during the release phase.
	constexpr uint8_t DP = 12 * 4;
	constexpr uint8_t RR = 7 * 4;
	constexpr uint8_t RS = 5 * 4;

	// determine KSR adjustment for envelope rates
	uint32_t ksrval = keycode >> (2 * (op_ksr(opoffs) ^ 1));
	cache.eg_rate[EG_DEPRESS] = DP;
	cache.eg_rate[EG_ATTACK] = effective_rate(op_attack_rate(opoffs) * 4, ksrval);
	cache.eg_rate[EG_DECAY] = effective_rate(op_decay_rate(opoffs) * 4, ksrval);
	if (op_eg_sustain(opoffs))
	{
		cache.eg_rate[EG_SUSTAIN] = 0;
		cache.eg_rate[EG_RELEASE] = ch_sustain(choffs) ? RS : effective_rate(op_release_rate(opoffs) * 4, ksrval);
	}
	else
	{
		cache.eg_rate[EG_SUSTAIN] = effective_rate(op_release_rate(opoffs) * 4, ksrval);
		cache.eg_rate[EG_RELEASE] = ch_sustain(choffs) ? RS : RR;
	}
}